

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void dmrC_show_bb(dmr_C *C,basic_block *bb)

{
  char cVar1;
  symbol *psVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  pseudo_t ppVar6;
  char *pcVar7;
  ulong *puVar8;
  instruction *insn;
  undefined1 local_68 [8];
  ptr_list_iter phiiter__;
  ptr_list_iter needsiter__;
  
  printf(".L%u:\n",(ulong)bb->nr);
  if (C->verbose != 0) {
    pcVar5 = dmrC_stream_name(C,*(uint *)&bb->pos >> 6 & 0x3fff);
    printf("%s:%d\n",pcVar5,(ulong)(*(uint *)&(bb->pos).field_0x4 & 0x7fffffff));
    ptrlist_forward_iterator((ptr_list_iter *)&phiiter__.__nr,(ptr_list *)bb->needs);
    ppVar6 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)&phiiter__.__nr);
    while (ppVar6 != (pseudo_t)0x0) {
      psVar2 = (ppVar6->field_5).sym;
      cVar1 = *(char *)psVar2;
      pcVar5 = dmrC_show_pseudo(C,ppVar6);
      if (cVar1 == '.') {
        printf("  **uses %s (from",pcVar5);
        ptrlist_forward_iterator((ptr_list_iter *)local_68,(ptr_list *)psVar2->replace);
        pcVar5 = " ";
        while (ppVar6 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_68),
              ppVar6 != (pseudo_t)0x0) {
          if (ppVar6 != &C->L->void_pseudo) {
            pcVar7 = dmrC_show_pseudo(C,ppVar6);
            printf("%s(%s:.L%u)",pcVar5,pcVar7,(ulong)((ppVar6->field_5).def)->bb->nr);
            pcVar5 = ", ";
          }
        }
        puts(")**");
      }
      else {
        printf("  **uses %s (from .L%u)**\n",pcVar5,
               (ulong)*(uint *)(*(long *)&(psVar2->pos).field_0x4 + 0x48));
      }
      ppVar6 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)&phiiter__.__nr);
    }
    ptrlist_forward_iterator((ptr_list_iter *)&phiiter__.__nr,(ptr_list *)bb->defines);
    while (ppVar6 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)&phiiter__.__nr),
          ppVar6 != (pseudo_t)0x0) {
      pcVar5 = dmrC_show_pseudo(C,ppVar6);
      printf("  **defines %s **\n",pcVar5);
    }
    if (bb->parents != (basic_block_list *)0x0) {
      ptrlist_forward_iterator((ptr_list_iter *)&phiiter__.__nr,(ptr_list *)bb->parents);
      while (puVar8 = (ulong *)ptrlist_iter_next((ptr_list_iter *)&phiiter__.__nr),
            puVar8 != (ulong *)0x0) {
        uVar3 = puVar8[9];
        pcVar5 = dmrC_stream_name(C,(uint)*puVar8 >> 6 & 0x3fff);
        printf("  **from .L%u (%s:%d:%d)**\n",(ulong)(uint)uVar3,pcVar5,
               (ulong)((uint)(*puVar8 >> 0x20) & 0x7fffffff),*puVar8 >> 0x16 & 0x3ff);
      }
    }
    if (bb->children != (basic_block_list *)0x0) {
      ptrlist_forward_iterator((ptr_list_iter *)&phiiter__.__nr,(ptr_list *)bb->children);
      while (puVar8 = (ulong *)ptrlist_iter_next((ptr_list_iter *)&phiiter__.__nr),
            puVar8 != (ulong *)0x0) {
        uVar3 = puVar8[9];
        pcVar5 = dmrC_stream_name(C,(uint)*puVar8 >> 6 & 0x3fff);
        printf("  **to .L%u (%s:%d:%d)**\n",(ulong)(uint)uVar3,pcVar5,
               (ulong)((uint)(*puVar8 >> 0x20) & 0x7fffffff),*puVar8 >> 0x16 & 0x3ff);
      }
    }
  }
  ptrlist_forward_iterator((ptr_list_iter *)&phiiter__.__nr,(ptr_list *)bb->insns);
  while (insn = (instruction *)ptrlist_iter_next((ptr_list_iter *)&phiiter__.__nr),
        insn != (instruction *)0x0) {
    if ((insn->bb != (basic_block *)0x0) || (1 < C->verbose)) {
      pcVar5 = dmrC_show_instruction(C,insn);
      printf("\t%s\n",pcVar5);
    }
  }
  iVar4 = dmrC_bb_terminated(bb);
  if (iVar4 == 0) {
    puts("\tEND");
  }
  return;
}

Assistant:

void dmrC_show_bb(struct dmr_C *C, struct basic_block *bb)
{
	struct instruction *insn;

	printf(".L%u:\n", bb->nr);
	if (C->verbose) {
		pseudo_t needs, defines;
		printf("%s:%d\n", dmrC_stream_name(C, bb->pos.stream), bb->pos.line);

		FOR_EACH_PTR(bb->needs, needs) {
			struct instruction *def = needs->def;
			if (def->opcode != OP_PHI) {
				printf("  **uses %s (from .L%u)**\n", dmrC_show_pseudo(C, needs), def->bb->nr);
			} else {
				pseudo_t phi;
				const char *sep = " ";
				printf("  **uses %s (from", dmrC_show_pseudo(C, needs));
				FOR_EACH_PTR(def->phi_list, phi) {
					if (phi == VOID_PSEUDO(C))
						continue;
					printf("%s(%s:.L%u)", sep, dmrC_show_pseudo(C, phi), phi->def->bb->nr);
					sep = ", ";
				} END_FOR_EACH_PTR(phi);		
				printf(")**\n");
			}
		} END_FOR_EACH_PTR(needs);

		FOR_EACH_PTR(bb->defines, defines) {
			printf("  **defines %s **\n", dmrC_show_pseudo(C, defines));
		} END_FOR_EACH_PTR(defines);

		if (bb->parents) {
			struct basic_block *from;
			FOR_EACH_PTR(bb->parents, from) {
				printf("  **from .L%u (%s:%d:%d)**\n", from->nr,
					dmrC_stream_name(C, from->pos.stream), from->pos.line, from->pos.pos);
			} END_FOR_EACH_PTR(from);
		}

		if (bb->children) {
			struct basic_block *to;
			FOR_EACH_PTR(bb->children, to) {
				printf("  **to .L%u (%s:%d:%d)**\n", to->nr,
					dmrC_stream_name(C, to->pos.stream), to->pos.line, to->pos.pos);
			} END_FOR_EACH_PTR(to);
		}
	}

	FOR_EACH_PTR(bb->insns, insn) {
		if (!insn->bb && C->verbose < 2)
			continue;
		printf("\t%s\n", dmrC_show_instruction(C, insn));
	} END_FOR_EACH_PTR(insn);
	if (!dmrC_bb_terminated(bb))
		printf("\tEND\n");
}